

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void computeJD(DateTime *p)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  
  if (p->validJD == '\0') {
    if (p->validYMD == '\0') {
      iVar4 = 2000;
      iVar2 = 1;
      iVar5 = 3;
    }
    else {
      iVar4 = p->Y;
      iVar2 = p->M;
      iVar5 = p->D + 2;
    }
    iVar1 = iVar2 + 0xc;
    if (2 < iVar2) {
      iVar1 = iVar2;
    }
    iVar4 = iVar4 - (uint)(iVar2 < 3);
    lVar3 = (long)(((double)(iVar4 / -100 + iVar5 + iVar4 / 400 +
                             (iVar1 * 0x4ab51 + 0x4ab51) / 10000 +
                            (iVar4 * 0x8ead + 0xa445afc) / 100) + -1524.5) * 86400000.0);
    p->iJD = lVar3;
    p->validJD = '\x01';
    if (p->validHMS != '\0') {
      lVar3 = (long)(p->s * 1000.0) + (long)p->m * 60000 + (long)p->h * 3600000 + lVar3;
      p->iJD = lVar3;
      if (p->validTZ != '\0') {
        p->iJD = lVar3 + (long)p->tz * -60000;
        p->validYMD = '\0';
        p->validHMS = '\0';
        p->validTZ = '\0';
        return;
      }
    }
  }
  return;
}

Assistant:

static void computeJD(DateTime *p){
  int Y, M, D, A, B, X1, X2;

  if( p->validJD ) return;
  if( p->validYMD ){
    Y = p->Y;
    M = p->M;
    D = p->D;
  }else{
    Y = 2000;  /* If no YMD specified, assume 2000-Jan-01 */
    M = 1;
    D = 1;
  }
  if( M<=2 ){
    Y--;
    M += 12;
  }
  A = Y/100;
  B = 2 - A + (A/4);
  X1 = 36525*(Y+4716)/100;
  X2 = 306001*(M+1)/10000;
  p->iJD = (sqlite3_int64)((X1 + X2 + D + B - 1524.5 ) * 86400000);
  p->validJD = 1;
  if( p->validHMS ){
    p->iJD += p->h*3600000 + p->m*60000 + (sqlite3_int64)(p->s*1000);
    if( p->validTZ ){
      p->iJD -= p->tz*60000;
      p->validYMD = 0;
      p->validHMS = 0;
      p->validTZ = 0;
    }
  }
}